

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O0

bool __thiscall MIDIplay::doRolandSysEx(MIDIplay *this,uint dev,uint8_t *data,size_t size)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  size_type sVar4;
  reference pMVar5;
  uint uVar6;
  bool bVar7;
  bool local_8d;
  byte local_78 [8];
  uint8_t channels_map [16];
  uint value_1;
  uint value;
  uint mode_1;
  uint target_channel;
  uint address;
  size_t i;
  uint checkvalue;
  uint checksum;
  uint mode;
  uint model;
  bool devicematch;
  size_t size_local;
  uint8_t *data_local;
  uint dev_local;
  MIDIplay *this_local;
  
  bVar7 = true;
  if (dev != 0x7f) {
    bVar7 = (dev & 0xf) == (uint)this->m_sysExDeviceId;
  }
  if ((5 < size) && (bVar7)) {
    bVar1 = 0;
    for (_target_channel = 0; _target_channel < size - 3; _target_channel = _target_channel + 1) {
      bVar1 = ((data + 2)[_target_channel] & 0x7f) + bVar1;
    }
    if ((0x80 - (bVar1 & 0x7f) & 0x7f) == (data[size - 1] & 0x7f)) {
      uVar2 = (data[2] & 0x7f) << 0x10;
      uVar6 = (data[3] & 0x7f) << 8;
      mode_1 = uVar2 | uVar6 | data[4] & 0x7f;
      value = 0;
      if ((uVar2 | uVar6 & 0xfff0ff | data[4] & 0x7f) == 0x401015) {
        mode_1 = 0x401015;
        value = data[3] & 0xf;
      }
      pbVar3 = data + 5;
      if ((data[1] & 0x7f) == 0x12) {
        uVar2 = (*data & 0x7f) << 0x18 | mode_1;
        if (uVar2 == 0x4200007f) {
          if ((size == 7) && ((dev & 0xf0) == 0x10)) {
            if ((this->hooks).onDebugMessage != (DebugMessageHook)0x0) {
              (*(this->hooks).onDebugMessage)
                        ((this->hooks).onDebugMessage_userData,
                         "SysEx: Caught Roland System Mode Set: %02X",(ulong)(*pbVar3 & 0x7f));
            }
            this->m_synthMode = 1;
            realTime_ResetState(this);
            return true;
          }
        }
        else if (uVar2 == 0x4240007f) {
          if ((size == 7) && ((dev & 0xf0) == 0x10)) {
            if ((this->hooks).onDebugMessage != (DebugMessageHook)0x0) {
              (*(this->hooks).onDebugMessage)
                        ((this->hooks).onDebugMessage_userData,"SysEx: Caught Roland Mode Set: %02X"
                         ,(ulong)(*pbVar3 & 0x7f));
            }
            this->m_synthMode = 1;
            realTime_ResetState(this);
            return true;
          }
        }
        else if ((((uVar2 == 0x42401015) && (size == 7)) && ((dev & 0xf0) == 0x10)) &&
                (sVar4 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>
                         ::size(&this->m_midiChannels), 0xf < sVar4)) {
          uVar2 = *pbVar3 & 0x7f;
          channels_map[0xc] = (char)uVar2;
          channels_map[0xd] = (char)(uVar2 >> 8);
          channels_map[0xe] = (char)(uVar2 >> 0x10);
          channels_map[0xf] = (char)(uVar2 >> 0x18);
          local_78[0] = 9;
          local_78[1] = 0;
          local_78[2] = 1;
          local_78[3] = 2;
          local_78[4] = 3;
          local_78[5] = 4;
          local_78[6] = 5;
          local_78[7] = 6;
          builtin_memcpy(channels_map,"\a\b\n\v\f\r\x0e\x0f",8);
          if ((this->hooks).onDebugMessage != (DebugMessageHook)0x0) {
            (*(this->hooks).onDebugMessage)
                      ((this->hooks).onDebugMessage_userData,
                       "SysEx: Caught Roland Percussion set: %02X on channel %u (from %X)",
                       (ulong)uVar2,(ulong)channels_map[(ulong)value - 8],(ulong)value);
          }
          local_8d = channels_map._12_4_ == 1 || channels_map._12_4_ == 2;
          pMVar5 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::
                   operator[](&this->m_midiChannels,(ulong)channels_map[(ulong)value - 8]);
          pMVar5->is_xg_percussion = local_8d;
          return true;
        }
      }
    }
    else if ((this->hooks).onDebugMessage != (DebugMessageHook)0x0) {
      (*(this->hooks).onDebugMessage)
                ((this->hooks).onDebugMessage_userData,"SysEx: Caught invalid roland SysEx message!"
                );
    }
  }
  return false;
}

Assistant:

bool MIDIplay::doRolandSysEx(unsigned dev, const uint8_t *data, size_t size)
{
    bool devicematch = dev == 0x7F || (dev & 0x0F) == m_sysExDeviceId;
    if(size < 6 || !devicematch)
        return false;

    unsigned model = data[0] & 0x7F;
    unsigned mode = data[1] & 0x7F;
    unsigned checksum = data[size - 1] & 0x7F;
    data += 2;
    size -= 3;

#if !defined(ADLMIDI_SKIP_ROLAND_CHECKSUM)
    {
        unsigned checkvalue = 0;
        for(size_t i = 0; i < size; ++i)
            checkvalue += data[i] & 0x7F;
        checkvalue = (128 - (checkvalue & 127)) & 127;
        if(checkvalue != checksum)
        {
            if(hooks.onDebugMessage)
                hooks.onDebugMessage(hooks.onDebugMessage_userData, "SysEx: Caught invalid roland SysEx message!");
            return false;
        }
    }
#endif

    unsigned address =
        (((unsigned)data[0] & 0x7F) << 16) |
        (((unsigned)data[1] & 0x7F) << 8)  |
        (((unsigned)data[2] & 0x7F));
    unsigned target_channel = 0;

    /* F0 41 10 42 12 40 00 7F 00 41 F7 */

    if((address & 0xFFF0FF) == 0x401015) // Turn channel 1 into percussion
    {
        address = 0x401015;
        target_channel = data[1] & 0x0F;
    }

    data += 3;
    size -= 3;

    if(mode != RolandMode_Send) // don't have MIDI-Out reply ability
        return false;

    // Mode Set
    // F0 {41 10 42 12} {40 00 7F} {00 41} F7

    // Custom drum channels
    // F0 {41 10 42 12} {40 1<ch> 15} {<state> <sum>} F7

    switch((model << 24) | address)
    {
    case (RolandModel_GS << 24) | 0x00007F: // System Mode Set
    {
        if(size != 1 || (dev & 0xF0) != 0x10)
            break;
        unsigned mode = data[0] & 0x7F;
        ADL_UNUSED(mode);//TODO: Hook this correctly!
        if(hooks.onDebugMessage)
            hooks.onDebugMessage(hooks.onDebugMessage_userData, "SysEx: Caught Roland System Mode Set: %02X", mode);
        m_synthMode = Mode_GS;
        realTime_ResetState();
        return true;
    }
    case (RolandModel_GS << 24) | 0x40007F: // Mode Set
    {
        if(size != 1 || (dev & 0xF0) != 0x10)
            break;
        unsigned value = data[0] & 0x7F;
        ADL_UNUSED(value);//TODO: Hook this correctly!
        if(hooks.onDebugMessage)
            hooks.onDebugMessage(hooks.onDebugMessage_userData, "SysEx: Caught Roland Mode Set: %02X", value);
        m_synthMode = Mode_GS;
        realTime_ResetState();
        return true;
    }
    case (RolandModel_GS << 24) | 0x401015: // Percussion channel
    {
        if(size != 1 || (dev & 0xF0) != 0x10)
            break;
        if(m_midiChannels.size() < 16)
            break;
        unsigned value = data[0] & 0x7F;
        const uint8_t channels_map[16] =
        {
            9, 0, 1, 2, 3, 4, 5, 6, 7, 8, 10, 11, 12, 13, 14, 15
        };
        if(hooks.onDebugMessage)
            hooks.onDebugMessage(hooks.onDebugMessage_userData,
                                 "SysEx: Caught Roland Percussion set: %02X on channel %u (from %X)",
                                 value, channels_map[target_channel], target_channel);
        m_midiChannels[channels_map[target_channel]].is_xg_percussion = ((value == 0x01)) || ((value == 0x02));
        return true;
    }
    }

    return false;
}